

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O1

void multipcm_write(void *info,UINT8 offset,UINT8 data)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  undefined7 in_register_00000031;
  
  iVar3 = (int)CONCAT71(in_register_00000031,offset);
  if (iVar3 < 0x10) {
    if (iVar3 == 0) {
      if ((long)*(int *)((long)info + 0x10a8) != -1) {
        write_slot((MultiPCM *)info,
                   (slot_t *)((long)info + (long)*(int *)((long)info + 0x10a8) * 0x98 + 8),
                   *(INT32 *)((long)info + 0x10ac),data);
        return;
      }
    }
    else {
      if (iVar3 == 1) {
        *(INT32 *)((long)info + 0x10a8) = VALUE_TO_CHANNEL[data & 0x1f];
        return;
      }
      if (iVar3 == 2) {
        bVar2 = 7;
        if (data < 7) {
          bVar2 = data;
        }
        *(uint *)((long)info + 0x10ac) = (uint)bVar2;
        return;
      }
    }
  }
  else {
    if (iVar3 == 0x10) {
      *(undefined1 *)((long)info + 0x10b0) = 1;
      *(uint *)((long)info + 0x10b4) = (uint)data << 0x14;
      uVar1 = (uint)data << 0x14 | 0x80000;
LAB_0016303d:
      *(uint *)((long)info + 0x10b8) = uVar1;
      return;
    }
    if (iVar3 == 0x11) {
      *(undefined1 *)((long)info + 0x10b0) = 1;
      *(uint *)((long)info + 0x10b4) = (uint)data << 0x13;
    }
    else if (iVar3 == 0x12) {
      *(undefined1 *)((long)info + 0x10b0) = 1;
      uVar1 = (uint)data << 0x13;
      goto LAB_0016303d;
    }
  }
  return;
}

Assistant:

static void multipcm_write(void *info, UINT8 offset, UINT8 data)
{
	MultiPCM *ptChip = (MultiPCM *)info;
	switch(offset)
	{
		case 0:     //Data write
			if (ptChip->cur_slot == -1)
				return;
			write_slot(ptChip, ptChip->slots + ptChip->cur_slot, ptChip->address, data);
			break;
		case 1:
			ptChip->cur_slot = VALUE_TO_CHANNEL[data & 0x1f];
			break;

		case 2:
			ptChip->address = (data > 7) ? 7 : data;
			break;

		// special SEGA banking
		case 0x10:	// 1 MB banking (Sega Model 1)
			ptChip->sega_banking = 1;
			ptChip->bank0 = (data << 20) | 0x000000;
			ptChip->bank1 = (data << 20) | 0x080000;
			break;
		case 0x11:	// 512 KB banking - low bank (Sega Multi 32)
			ptChip->sega_banking = 1;
			ptChip->bank0 = data << 19;
			break;
		case 0x12:	// 512 KB banking - high bank (Sega Multi 32)
			ptChip->sega_banking = 1;
			ptChip->bank1 = data << 19;
			break;
	}
}